

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

bool __thiscall
TSMuxer::appendM2TSNullPacketToFile
          (TSMuxer *this,int64_t curFileSize,int counter,int *packetsWrited)

{
  int iVar1;
  File *this_00;
  ssize_t sVar2;
  size_t __nbytes;
  uint uVar3;
  long lVar4;
  bool bVar5;
  uint8_t tmpBuff [192];
  uint local_f8;
  undefined1 local_f4 [196];
  
  *packetsWrited = 0;
  bVar5 = false;
  __nbytes = 0;
  this_00 = (File *)__dynamic_cast(this->m_muxFile,&AbstractOutputStream::typeinfo,&File::typeinfo);
  File::seek(this_00,curFileSize + -0xc0,smBegin);
  sVar2 = File::read(this_00,(int)&local_f8,(void *)0xc0,__nbytes);
  if ((int)sVar2 == 0xc0) {
    memcpy(local_f4,this->m_nullBuffer,0xbc);
    bVar5 = (curFileSize * -0x5555555555555555 + 0x2aaaaaaaaaaaa800U >> 0xb |
            curFileSize * -0x5555555555555555 << 0x35) < 0xaaaaaaaaaaaab;
    if (!bVar5) {
      uVar3 = counter << 0x18;
      lVar4 = curFileSize + 0xc0;
      do {
        local_f8 = local_f8 & 0xf0ffffff | uVar3 & 0xf000000;
        iVar1 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5]
                )(this_00,&local_f8,0xc0);
        if (iVar1 != 0xc0) {
          return false;
        }
        *packetsWrited = *packetsWrited + 1;
        uVar3 = uVar3 + 0x1000000;
        bVar5 = lVar4 == (((ulong)(lVar4 / 6 + (lVar4 >> 0x3f)) >> 10) - (lVar4 >> 0x3f)) * 0x1800;
        lVar4 = lVar4 + 0xc0;
      } while (!bVar5);
    }
  }
  return bVar5;
}

Assistant:

bool TSMuxer::appendM2TSNullPacketToFile(const int64_t curFileSize, int counter, int* packetsWrited) const
{
    *packetsWrited = 0;
    while (counter < 0) counter += 16;
    uint8_t tmpBuff[192];

    File* file = dynamic_cast<File*>(m_muxFile);

    file->seek(curFileSize - 192, File::SeekMethod::smBegin);
    const int readCnt = file->read(tmpBuff, 192);
    if (readCnt != 192)
        return false;
    memcpy(tmpBuff + 4, m_nullBuffer, TS_FRAME_SIZE);
    const auto tsPacket = reinterpret_cast<TSPacket*>(tmpBuff);
    for (int64_t newFileSize = curFileSize; newFileSize % (2048LL * 3) != 0; newFileSize += 192)
    {
        tsPacket->counter = counter++;
        if (file->write(tmpBuff, 192) != 192)
            return false;
        // m_muxedPacketCnt[m_muxedPacketCnt.size()-1]++;
        (*packetsWrited)++;
    }
    return true;
}